

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.h
# Opt level: O0

void __thiscall sptk::GaussianMixtureModeling::Buffer::~Buffer(Buffer *this)

{
  undefined8 *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  *in_RDI = &PTR__Buffer_0013bbb0;
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector
            ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)unaff_retaddr)
  ;
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

virtual ~Buffer() {
    }